

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O3

ssize_t archive_write_zip_data(archive_write *a,void *buff,size_t s)

{
  uint8_t *puVar1;
  byte c;
  undefined1 uVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  undefined4 uVar6;
  int iVar7;
  char *pcVar8;
  undefined8 uVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  uint8_t *in;
  size_t sVar13;
  uint i;
  ulong uVar14;
  undefined1 *puVar15;
  size_t sVar16;
  uint8_t salt [18];
  uint8_t key [12];
  size_t local_98;
  undefined1 auStack_90 [16];
  archive_hmac_sha1_ctx *local_80;
  undefined8 local_78;
  undefined1 uStack_70;
  undefined1 local_6d;
  uint8_t auStack_68 [56];
  
  pvVar3 = a->format_data;
  if ((long)*(ulong *)((long)pvVar3 + 0x28) < (long)s) {
    s = *(ulong *)((long)pvVar3 + 0x28);
  }
  *(long *)((long)pvVar3 + 0x20) = *(long *)((long)pvVar3 + 0x20) + s;
  if (s == 0) {
    return 0;
  }
  if ((*(byte *)((long)pvVar3 + 0x44) & 1) != 0) {
    if (*(int *)((long)pvVar3 + 0x40) - 2U < 2) {
      if (*(char *)((long)pvVar3 + 0xb8) == '\0') {
        pcVar8 = __archive_write_get_passphrase(a);
        if (pcVar8 == (char *)0x0) {
LAB_00169fbb:
          pcVar8 = "Encryption needs passphrase";
        }
        else {
          iVar7 = *(int *)((long)pvVar3 + 0x40);
          lVar12 = (ulong)(iVar7 != 2) * 8;
          uVar14 = lVar12 + 8;
          iVar4 = archive_random(&local_98,uVar14);
          if (iVar4 != 0) {
LAB_00169fa5:
            archive_set_error(&a->archive,-1,"Can\'t generate random number for encryption");
            iVar7 = -0x1e;
            goto LAB_0016a1c7;
          }
          sVar16 = (ulong)(iVar7 != 2) * 0x10 + 0x10;
          sVar10 = strlen(pcVar8);
          uVar11 = (ulong)(uint)((int)sVar16 * 2);
          pbkdf2_sha1(pcVar8,sVar10,(uint8_t *)&local_98,uVar14,1000,(uint8_t *)&local_78,uVar11 | 2
                     );
          iVar4 = aes_ctr_init((archive_crypto_ctx *)((long)pvVar3 + 0x60),(uint8_t *)&local_78,
                               sVar16);
          if (iVar4 == 0) {
            iVar4 = __hmac_sha1_init((archive_hmac_sha1_ctx *)((long)pvVar3 + 0xc0),
                                     auStack_68 + (ulong)(iVar7 != 2) * 0x10,sVar16);
            if (iVar4 == 0) {
              uVar2 = *(undefined1 *)((long)&local_78 + uVar11 + 1);
              auStack_90[(ulong)(iVar7 != 2) * 8] = *(undefined1 *)((long)&local_78 + uVar11);
              auStack_90[lVar12 + 1] = uVar2;
              uVar14 = uVar14 | 2;
              iVar7 = __archive_write_output(a,&local_98,uVar14);
              if (iVar7 != 0) goto LAB_0016a1c7;
              puVar15 = (undefined1 *)((long)pvVar3 + 0xb8);
              *(long *)((long)pvVar3 + 0x108) = *(long *)((long)pvVar3 + 0x108) + uVar14;
              *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + uVar14;
              *(undefined1 *)((long)pvVar3 + 200) = 1;
              goto LAB_0016a248;
            }
            aes_ctr_release((archive_crypto_ctx *)((long)pvVar3 + 0x60));
            pcVar8 = "Failed to initialize HMAC-SHA1";
          }
          else {
            pcVar8 = "Decryption is unsupported due to lack of crypto library";
          }
        }
        archive_set_error(&a->archive,-1,pcVar8);
        iVar7 = -0x19;
        goto LAB_0016a1c7;
      }
    }
    else if ((*(int *)((long)pvVar3 + 0x40) == 1) && (*(char *)((long)pvVar3 + 0x58) == '\0')) {
      pcVar8 = __archive_write_get_passphrase(a);
      if (pcVar8 == (char *)0x0) goto LAB_00169fbb;
      iVar7 = archive_random(&local_78,0xb);
      if (iVar7 != 0) goto LAB_00169fa5;
      sVar10 = strlen(pcVar8);
      *(undefined8 *)((long)pvVar3 + 0x4c) = 0x2345678912345678;
      *(undefined4 *)((long)pvVar3 + 0x54) = 0x34567890;
      if (sVar10 != 0) {
        sVar13 = 0;
        do {
          trad_enc_update_keys((trad_enc_ctx *)((long)pvVar3 + 0x4c),pcVar8[sVar13]);
          sVar13 = sVar13 + 1;
        } while (sVar10 != sVar13);
      }
      puVar15 = (undefined1 *)((long)pvVar3 + 0x58);
      local_6d = *(undefined1 *)((long)pvVar3 + 0x59);
      lVar12 = 0;
      do {
        c = *(byte *)((long)&local_78 + lVar12);
        uVar5 = *(uint *)((long)pvVar3 + 0x54) | 2;
        auStack_90[lVar12 + -8] = (byte)((uVar5 ^ 1) * uVar5 >> 8) ^ c;
        trad_enc_update_keys((trad_enc_ctx *)((long)pvVar3 + 0x4c),c);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0xc);
      iVar7 = __archive_write_output(a,&local_98,0xc);
      if (iVar7 != 0) goto LAB_0016a1c7;
      *(long *)((long)pvVar3 + 0x108) = *(long *)((long)pvVar3 + 0x108) + 0xc;
      *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + 0xc;
LAB_0016a248:
      *puVar15 = 1;
    }
  }
  iVar7 = *(int *)((long)pvVar3 + 0x3c);
  if (iVar7 < 0xe) {
    if (iVar7 == 0) {
      if ((*(char *)((long)pvVar3 + 0x58) == '\0') && (*(char *)((long)pvVar3 + 0xb8) == '\0')) {
        iVar7 = __archive_write_output(a,buff,s);
        if (iVar7 != 0) {
LAB_0016a1c7:
          return (long)iVar7;
        }
        *(long *)((long)pvVar3 + 0x108) = *(long *)((long)pvVar3 + 0x108) + s;
        *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + s;
      }
      else if (0 < (long)s) {
        puVar1 = (uint8_t *)(s + (long)buff);
        local_80 = (archive_hmac_sha1_ctx *)((long)pvVar3 + 0xc0);
        in = (uint8_t *)buff;
        do {
          if (*(char *)((long)pvVar3 + 0x58) == '\0') {
            local_78._0_4_ = (uint)*(undefined8 *)((long)pvVar3 + 0x238);
            local_78._4_4_ = (undefined4)((ulong)*(undefined8 *)((long)pvVar3 + 0x238) >> 0x20);
            iVar7 = aes_ctr_update((archive_crypto_ctx *)((long)pvVar3 + 0x60),in,
                                   (long)puVar1 - (long)in,*(uint8_t **)((long)pvVar3 + 0x240),
                                   &local_78);
            if (iVar7 < 0) goto LAB_00169fd4;
            __hmac_sha1_update(local_80,*(uint8_t **)((long)pvVar3 + 0x240),
                               CONCAT44(local_78._4_4_,(uint)local_78));
            sVar16 = CONCAT44(local_78._4_4_,(uint)local_78);
          }
          else {
            local_78._0_4_ =
                 trad_enc_encrypt_update
                           ((trad_enc_ctx *)((long)pvVar3 + 0x4c),in,(long)puVar1 - (long)in,
                            *(uint8_t **)((long)pvVar3 + 0x240),*(size_t *)((long)pvVar3 + 0x238));
            sVar16 = (size_t)(uint)local_78;
            local_78._4_4_ = 0;
          }
          iVar7 = __archive_write_output(a,*(void **)((long)pvVar3 + 0x240),sVar16);
          if (iVar7 != 0) goto LAB_0016a1c7;
          lVar12 = CONCAT44(local_78._4_4_,(uint)local_78);
          *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + lVar12;
          *(long *)((long)pvVar3 + 0x108) = *(long *)((long)pvVar3 + 0x108) + lVar12;
          in = in + lVar12;
        } while (in < puVar1);
      }
    }
    else {
      if (iVar7 != 8) {
LAB_00169f52:
        archive_set_error(&a->archive,-1,"Invalid ZIP compression type");
        return -0x1e;
      }
      *(void **)((long)pvVar3 + 0x138) = buff;
      *(int *)((long)pvVar3 + 0x140) = (int)s;
      do {
        iVar7 = deflate((long)pvVar3 + 0x138,0);
        if (iVar7 == -2) {
          return -0x1e;
        }
        if (*(int *)((long)pvVar3 + 0x158) == 0) {
          if (*(char *)((long)pvVar3 + 0x58) == '\0') {
            if (*(char *)((long)pvVar3 + 0xb8) != '\0') {
              sVar16 = *(size_t *)((long)pvVar3 + 0x238);
              local_78._0_4_ = (uint)sVar16;
              local_78._4_4_ = (undefined4)(sVar16 >> 0x20);
              iVar7 = aes_ctr_update((archive_crypto_ctx *)((long)pvVar3 + 0x60),
                                     *(uint8_t **)((long)pvVar3 + 0x240),sVar16,
                                     *(uint8_t **)((long)pvVar3 + 0x240),&local_78);
              if (iVar7 < 0) goto LAB_00169fd4;
              __hmac_sha1_update((archive_hmac_sha1_ctx *)((long)pvVar3 + 0xc0),
                                 *(uint8_t **)((long)pvVar3 + 0x240),
                                 *(size_t *)((long)pvVar3 + 0x238));
            }
          }
          else {
            trad_enc_encrypt_update
                      ((trad_enc_ctx *)((long)pvVar3 + 0x4c),*(uint8_t **)((long)pvVar3 + 0x240),
                       *(size_t *)((long)pvVar3 + 0x238),*(uint8_t **)((long)pvVar3 + 0x240),
                       *(size_t *)((long)pvVar3 + 0x238));
          }
          iVar7 = __archive_write_output
                            (a,*(void **)((long)pvVar3 + 0x240),*(size_t *)((long)pvVar3 + 0x238));
          if (iVar7 != 0) goto LAB_0016a1c7;
          lVar12 = *(long *)((long)pvVar3 + 0x238);
          *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + lVar12;
          *(long *)((long)pvVar3 + 0x108) = *(long *)((long)pvVar3 + 0x108) + lVar12;
          *(undefined8 *)((long)pvVar3 + 0x150) = *(undefined8 *)((long)pvVar3 + 0x240);
          *(int *)((long)pvVar3 + 0x158) = (int)lVar12;
        }
      } while (*(int *)((long)pvVar3 + 0x140) != 0);
    }
  }
  else {
    if (iVar7 == 0xe) {
      if (*(char *)((long)pvVar3 + 0x138) != '\0') {
        local_78._0_4_ = 0x50205;
        local_78._4_4_ =
             CONCAT31((int3)*(undefined4 *)((long)pvVar3 + 0x140),
                      ((char)*(undefined4 *)((long)pvVar3 + 0x15c) * '\x05' +
                      (char)*(undefined4 *)((long)pvVar3 + 0x158)) * '\t' +
                      (char)*(undefined4 *)((long)pvVar3 + 0x154));
        uStack_70 = (undefined1)((uint)*(undefined4 *)((long)pvVar3 + 0x140) >> 0x18);
        if ((*(char *)((long)pvVar3 + 0x58) == '\0') && (*(char *)((long)pvVar3 + 0xb8) == '\0')) {
          iVar7 = __archive_write_output(a,&local_78,9);
          if (iVar7 != 0) goto LAB_0016a1c7;
          *(long *)((long)pvVar3 + 0x108) = *(long *)((long)pvVar3 + 0x108) + 9;
          *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + 9;
        }
        else {
          lVar12 = 0;
          do {
            if (*(char *)((long)pvVar3 + 0x58) == '\0') {
              local_98 = *(size_t *)((long)pvVar3 + 0x238);
              iVar7 = aes_ctr_update((archive_crypto_ctx *)((long)pvVar3 + 0x60),
                                     (uint8_t *)((long)&local_78 + lVar12),9 - lVar12,
                                     *(uint8_t **)((long)pvVar3 + 0x240),&local_98);
              if (iVar7 < 0) goto LAB_00169fd4;
              __hmac_sha1_update((archive_hmac_sha1_ctx *)((long)pvVar3 + 0xc0),
                                 *(uint8_t **)((long)pvVar3 + 0x240),local_98);
            }
            else {
              uVar5 = trad_enc_encrypt_update
                                ((trad_enc_ctx *)((long)pvVar3 + 0x4c),
                                 (uint8_t *)((long)&local_78 + lVar12),9 - lVar12,
                                 *(uint8_t **)((long)pvVar3 + 0x240),
                                 *(size_t *)((long)pvVar3 + 0x238));
              local_98 = (size_t)uVar5;
            }
            iVar7 = __archive_write_output(a,*(void **)((long)pvVar3 + 0x240),local_98);
            if (iVar7 != 0) goto LAB_0016a1c7;
            *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + local_98;
            *(long *)((long)pvVar3 + 0x108) = *(long *)((long)pvVar3 + 0x108) + local_98;
            lVar12 = lVar12 + local_98;
          } while (lVar12 < 9);
        }
        *(undefined1 *)((long)pvVar3 + 0x138) = 0;
      }
    }
    else {
      if (iVar7 == 0x5d) {
        *(void **)((long)pvVar3 + 0x140) = buff;
        *(size_t *)((long)pvVar3 + 0x148) = s;
        *(undefined8 *)((long)pvVar3 + 0x150) = 0;
        local_80 = (archive_hmac_sha1_ctx *)((long)pvVar3 + 0xc0);
        do {
          uVar9 = ZSTD_compressStream(*(undefined8 *)((long)pvVar3 + 0x138),(long)pvVar3 + 0x158,
                                      (long)pvVar3 + 0x140);
          iVar7 = ZSTD_isError(uVar9);
          if (iVar7 != 0) {
            return -0x1e;
          }
          if (*(long *)((long)pvVar3 + 0x168) == *(long *)((long)pvVar3 + 0x160)) {
            if (*(char *)((long)pvVar3 + 0x58) == '\0') {
              if (*(char *)((long)pvVar3 + 0xb8) != '\0') {
                sVar16 = *(size_t *)((long)pvVar3 + 0x238);
                local_78._0_4_ = (uint)sVar16;
                local_78._4_4_ = (undefined4)(sVar16 >> 0x20);
                iVar7 = aes_ctr_update((archive_crypto_ctx *)((long)pvVar3 + 0x60),
                                       *(uint8_t **)((long)pvVar3 + 0x240),sVar16,
                                       *(uint8_t **)((long)pvVar3 + 0x240),&local_78);
                if (iVar7 < 0) goto LAB_00169fd4;
                __hmac_sha1_update(local_80,*(uint8_t **)((long)pvVar3 + 0x240),
                                   *(size_t *)((long)pvVar3 + 0x238));
              }
            }
            else {
              trad_enc_encrypt_update
                        ((trad_enc_ctx *)((long)pvVar3 + 0x4c),*(uint8_t **)((long)pvVar3 + 0x240),
                         *(size_t *)((long)pvVar3 + 0x238),*(uint8_t **)((long)pvVar3 + 0x240),
                         *(size_t *)((long)pvVar3 + 0x238));
            }
            iVar7 = __archive_write_output
                              (a,*(void **)((long)pvVar3 + 0x240),*(size_t *)((long)pvVar3 + 0x238))
            ;
            if (iVar7 != 0) goto LAB_0016a1c7;
            lVar12 = *(long *)((long)pvVar3 + 0x238);
            *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + lVar12;
            *(long *)((long)pvVar3 + 0x108) = *(long *)((long)pvVar3 + 0x108) + lVar12;
            *(undefined8 *)((long)pvVar3 + 0x158) = *(undefined8 *)((long)pvVar3 + 0x240);
            *(long *)((long)pvVar3 + 0x160) = lVar12;
            *(undefined8 *)((long)pvVar3 + 0x168) = 0;
          }
        } while (*(long *)((long)pvVar3 + 0x150) != *(long *)((long)pvVar3 + 0x148));
        goto LAB_00169f1e;
      }
      if (iVar7 != 0x5f) goto LAB_00169f52;
    }
    *(void **)((long)pvVar3 + 0x1b0) = buff;
    *(size_t *)((long)pvVar3 + 0x1b8) = s & 0xffffffff;
    do {
      iVar7 = lzma_code((long)pvVar3 + 0x1b0,0);
      if (iVar7 == 5) {
        return -0x1e;
      }
      if (*(long *)((long)pvVar3 + 0x1d0) == 0) {
        if (*(char *)((long)pvVar3 + 0x58) == '\0') {
          if (*(char *)((long)pvVar3 + 0xb8) != '\0') {
            sVar16 = *(size_t *)((long)pvVar3 + 0x238);
            local_78._0_4_ = (uint)sVar16;
            local_78._4_4_ = (undefined4)(sVar16 >> 0x20);
            iVar7 = aes_ctr_update((archive_crypto_ctx *)((long)pvVar3 + 0x60),
                                   *(uint8_t **)((long)pvVar3 + 0x240),sVar16,
                                   *(uint8_t **)((long)pvVar3 + 0x240),&local_78);
            if (iVar7 < 0) {
LAB_00169fd4:
              archive_set_error(&a->archive,-1,"Failed to encrypt file");
              return -0x19;
            }
            __hmac_sha1_update((archive_hmac_sha1_ctx *)((long)pvVar3 + 0xc0),
                               *(uint8_t **)((long)pvVar3 + 0x240),*(size_t *)((long)pvVar3 + 0x238)
                              );
          }
        }
        else {
          trad_enc_encrypt_update
                    ((trad_enc_ctx *)((long)pvVar3 + 0x4c),*(uint8_t **)((long)pvVar3 + 0x240),
                     *(size_t *)((long)pvVar3 + 0x238),*(uint8_t **)((long)pvVar3 + 0x240),
                     *(size_t *)((long)pvVar3 + 0x238));
        }
        iVar7 = __archive_write_output
                          (a,*(void **)((long)pvVar3 + 0x240),*(size_t *)((long)pvVar3 + 0x238));
        if (iVar7 != 0) goto LAB_0016a1c7;
        uVar14 = *(ulong *)((long)pvVar3 + 0x238);
        *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + uVar14;
        *(long *)((long)pvVar3 + 0x108) = *(long *)((long)pvVar3 + 0x108) + uVar14;
        *(undefined8 *)((long)pvVar3 + 0x1c8) = *(undefined8 *)((long)pvVar3 + 0x240);
        *(ulong *)((long)pvVar3 + 0x1d0) = uVar14 & 0xffffffff;
      }
    } while (*(long *)((long)pvVar3 + 0x1b8) != 0);
  }
LAB_00169f1e:
  *(long *)((long)pvVar3 + 0x28) = *(long *)((long)pvVar3 + 0x28) - s;
  if ((*(char *)((long)pvVar3 + 0xb8) == '\0') || (*(int *)((long)pvVar3 + 0x5c) != 2)) {
    uVar6 = (**(code **)((long)pvVar3 + 0xe0))
                      (*(undefined4 *)((long)pvVar3 + 0x38),buff,s & 0xffffffff);
    *(undefined4 *)((long)pvVar3 + 0x38) = uVar6;
  }
  return s;
}

Assistant:

static ssize_t
archive_write_zip_data(struct archive_write *a, const void *buff, size_t s)
{
	int ret;
	struct zip *zip = a->format_data;

	if ((int64_t)s > zip->entry_uncompressed_limit)
		s = (size_t)zip->entry_uncompressed_limit;
	zip->entry_uncompressed_written += s;

	if (s == 0) return 0;

	if (zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED) {
		switch (zip->entry_encryption) {
		case ENCRYPTION_TRADITIONAL:
			/* Initialize traditional PKWARE encryption context. */
			if (!zip->tctx_valid) {
				ret = init_traditional_pkware_encryption(a);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->tctx_valid = 1;
			}
			break;
		case ENCRYPTION_WINZIP_AES128:
		case ENCRYPTION_WINZIP_AES256:
			if (!zip->cctx_valid) {
				ret = init_winzip_aes_encryption(a);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->cctx_valid = zip->hctx_valid = 1;
			}
			break;
		case ENCRYPTION_NONE:
		default:
			break;
		}
	}

	switch (zip->entry_compression) {
	case COMPRESSION_STORE:
		if (zip->tctx_valid || zip->cctx_valid) {
			const uint8_t *rb = (const uint8_t *)buff;
			const uint8_t * const re = rb + s;

			while (rb < re) {
				size_t l;

				if (zip->tctx_valid) {
					l = trad_enc_encrypt_update(&zip->tctx,
					    rb, re - rb,
					    zip->buf, zip->len_buf);
				} else {
					l = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
					    &zip->cctx,
					    rb, re - rb, zip->buf, &l);
					if (ret < 0) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
					    zip->buf, l);
				}
				ret = __archive_write_output(a, zip->buf, l);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += l;
				zip->written_bytes += l;
				rb += l;
			}
		} else {
			ret = __archive_write_output(a, buff, s);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->written_bytes += s;
			zip->entry_compressed_written += s;
		}
		break;
#ifdef HAVE_ZLIB_H
	case COMPRESSION_DEFLATE:
		zip->stream.deflate.next_in = (unsigned char*)(uintptr_t)buff;
		zip->stream.deflate.avail_in = (uInt)s;
		do {
			ret = deflate(&zip->stream.deflate, Z_NO_FLUSH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			if (zip->stream.deflate.avail_out == 0) {
				if (zip->tctx_valid) {
					trad_enc_encrypt_update(&zip->tctx,
					    zip->buf, zip->len_buf,
					    zip->buf, zip->len_buf);
				} else if (zip->cctx_valid) {
					size_t outl = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
					    &zip->cctx,
					    zip->buf, zip->len_buf,
					    zip->buf, &outl);
					if (ret < 0) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
					    zip->buf, zip->len_buf);
				}
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.deflate.next_out = zip->buf;
				zip->stream.deflate.avail_out = (uInt)zip->len_buf;
			}
		} while (zip->stream.deflate.avail_in != 0);
		break;
#endif
#if defined(HAVE_ZSTD_H) && HAVE_ZSTD_compressStream
	case COMPRESSION_ZSTD:
		zip->stream.zstd.in.src = buff;
		zip->stream.zstd.in.size = s;
		zip->stream.zstd.in.pos = 0;
		do {
			size_t zret = ZSTD_compressStream(zip->stream.zstd.context,
				&zip->stream.zstd.out, &zip->stream.zstd.in);
			if (ZSTD_isError(zret))
				return (ARCHIVE_FATAL);
			if (zip->stream.zstd.out.pos == zip->stream.zstd.out.size) {
				if (zip->tctx_valid) {
					trad_enc_encrypt_update(&zip->tctx,
						zip->buf, zip->len_buf,
						zip->buf, zip->len_buf);
				} else if (zip->cctx_valid) {
					size_t outl = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
						&zip->cctx,
						zip->buf, zip->len_buf,
						zip->buf, &outl);
					if (ret < 0) {
						archive_set_error(&a->archive,
							ARCHIVE_ERRNO_MISC,
							"Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
						zip->buf, zip->len_buf);
				}
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.zstd.out.dst = zip->buf;
				zip->stream.zstd.out.size = zip->len_buf;
				zip->stream.zstd.out.pos = 0;
			}
		} while (zip->stream.zstd.in.pos != zip->stream.zstd.in.size);
		break;
#endif
#ifdef HAVE_BZLIB_H
	case COMPRESSION_BZIP2:
		zip->stream.bzip2.next_in = (char*)(uintptr_t)buff;
		zip->stream.bzip2.avail_in = (unsigned int)s;
		do {
			ret = BZ2_bzCompress(&zip->stream.bzip2, BZ_RUN);
			if (ret != BZ_RUN_OK)
				return (ARCHIVE_FATAL);
			if (zip->stream.bzip2.avail_out == 0) {
				if (zip->tctx_valid) {
					trad_enc_encrypt_update(&zip->tctx,
						zip->buf, zip->len_buf,
						zip->buf, zip->len_buf);
				} else if (zip->cctx_valid) {
					size_t outl = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
						&zip->cctx,
						zip->buf, zip->len_buf,
						zip->buf, &outl);
					if (ret < 0) {
						archive_set_error(&a->archive,
							ARCHIVE_ERRNO_MISC,
							"Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
						zip->buf, zip->len_buf);
				}
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.bzip2.next_out = (char*)zip->buf;
				zip->stream.bzip2.avail_out = (unsigned int)zip->len_buf;
			}
		} while (zip->stream.bzip2.avail_in != 0);
		break;
#endif
#ifdef HAVE_LZMA_H
	case COMPRESSION_LZMA:
		if (zip->stream.lzma.headers_to_write) {
			/* LZMA Alone and ZIP's LZMA format (i.e. id 14) are almost
			 * the same. Here's an example of a structure of LZMA Alone:
			 *
			 * $ cat /bin/ls | lzma | xxd | head -n 1
			 * 00000000: 5d00 0080 00ff ffff ffff ffff ff00 2814
			 *
			 *    5 bytes        8 bytes        n bytes
			 * <lzma_params><uncompressed_size><data...>
			 *
			 * lzma_params is a 5-byte blob that has to be decoded to
			 * extract parameters of this LZMA stream. The
			 * uncompressed_size field is an uint64_t value that contains
			 * information about the size of the uncompressed file, or
			 * UINT64_MAX if this value is unknown. The <data...> part is
			 * the actual LZMA-compressed data stream.
			 *
			 * Now here's the structure of ZIP's LZMA format:
			 *
			 * $ cat stream_inside_zipx | xxd | head -n 1
			 * 00000000: 0914 0500 5d00 8000 0000 2814 .... ....
			 *
			 *  2byte   2byte    5 bytes     n bytes
			 * <magic1><magic2><lzma_params><data...>
			 *
			 * This means that ZIP's LZMA format contains an additional
			 * magic1 and magic2 headers, the lzma_params field contains
			 * the same parameter set as in LZMA Alone, and the <data...>
			 * field is the same as in LZMA Alone as well. However, note
			 * that ZIP's format is missing the uncompressed_size field.
			 *
			 * So we need to write a raw LZMA stream, set up for LZMA1
			 * (i.e. the algorithm variant LZMA Alone uses), which was
			 * done above in the initialisation but first we need to
			 * write ZIP's LZMA header, as if it were Stored data. Then
			 * we can use the raw stream as if it were any other. magic1
			 * being version numbers and magic2 being lzma_params's size,
			 * they get written in without further ado but lzma_params
			 * requires to use other functions than the usual lzma_stream
			 * manipulating ones, hence the additional book-keeping
			 * required alongside the lzma_stream.
			 */
			uint8_t buf[9] = { LZMA_VERSION_MAJOR, LZMA_VERSION_MINOR, 5, 0 };
			lzma_lzma_props_encode(&zip->stream.lzma.options, buf + 4);
			const size_t sh = 9;
			if (zip->tctx_valid || zip->cctx_valid) {
				uint8_t* header = buf;
				const uint8_t * const rh = header + sh;

				while (header < rh) {
					size_t l;

					if (zip->tctx_valid) {
						l = trad_enc_encrypt_update(&zip->tctx,
							header, rh - header,
							zip->buf, zip->len_buf);
					} else {
						l = zip->len_buf;
						ret = archive_encrypto_aes_ctr_update(
							&zip->cctx,
							header, rh - header, zip->buf, &l);
						if (ret < 0) {
							archive_set_error(&a->archive,
								ARCHIVE_ERRNO_MISC,
								"Failed to encrypt file");
							return (ARCHIVE_FAILED);
						}
						archive_hmac_sha1_update(&zip->hctx,
							zip->buf, l);
					}
					ret = __archive_write_output(a, zip->buf, l);
					if (ret != ARCHIVE_OK)
						return (ret);
					zip->entry_compressed_written += l;
					zip->written_bytes += l;
					header += l;
				}
			} else {
				ret = __archive_write_output(a, buf, sh);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->written_bytes += sh;
				zip->entry_compressed_written += sh;
			}
			zip->stream.lzma.headers_to_write = 0;
		}
		/* FALLTHROUGH */
	case COMPRESSION_XZ:
		zip->stream.lzma.context.next_in = (unsigned char*)(uintptr_t)buff;
		zip->stream.lzma.context.avail_in = (unsigned int)s;
		do {
			ret = lzma_code(&zip->stream.lzma.context, LZMA_RUN);
			if (ret == LZMA_MEM_ERROR)
				return (ARCHIVE_FATAL);
			if (zip->stream.lzma.context.avail_out == 0) {
				if (zip->tctx_valid) {
					trad_enc_encrypt_update(&zip->tctx,
						zip->buf, zip->len_buf,
						zip->buf, zip->len_buf);
				} else if (zip->cctx_valid) {
					size_t outl = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
						&zip->cctx,
						zip->buf, zip->len_buf,
						zip->buf, &outl);
					if (ret < 0) {
						archive_set_error(&a->archive,
							ARCHIVE_ERRNO_MISC,
							"Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
						zip->buf, zip->len_buf);
				}
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.lzma.context.next_out = zip->buf;
				zip->stream.lzma.context.avail_out = (unsigned int)zip->len_buf;
			}
		} while (zip->stream.lzma.context.avail_in != 0);
		break;
#endif
	case COMPRESSION_UNSPECIFIED:
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid ZIP compression type");
		return ARCHIVE_FATAL;
	}

	zip->entry_uncompressed_limit -= s;
	if (!zip->cctx_valid || zip->aes_vendor != AES_VENDOR_AE_2)
		zip->entry_crc32 =
		    zip->crc32func(zip->entry_crc32, buff, (unsigned)s);
	return (s);
}